

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Dictionary.cc
# Opt level: O0

void __thiscall QPDFObjectHandle::removeKey(QPDFObjectHandle *this,string *key)

{
  bool bVar1;
  allocator<char> local_59;
  string local_58;
  uint local_38;
  undefined1 local_28 [8];
  Dictionary dict;
  string *key_local;
  QPDFObjectHandle *this_local;
  
  dict.super_BaseDictionary.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)key;
  as_dictionary((QPDFObjectHandle *)local_28,(typed)this);
  bVar1 = ::qpdf::BaseHandle::operator_cast_to_bool((BaseHandle *)local_28);
  if (bVar1) {
    ::qpdf::BaseDictionary::removeKey
              ((BaseDictionary *)local_28,
               (string *)
               dict.super_BaseDictionary.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  local_38 = (uint)bVar1;
  ::qpdf::Dictionary::~Dictionary((Dictionary *)local_28);
  if (local_38 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"ignoring key removal request",&local_59);
    typeWarning(this,"dictionary",&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    QTC::TC("qpdf","QPDFObjectHandle dictionary ignoring removeKey",0);
  }
  return;
}

Assistant:

void
QPDFObjectHandle::removeKey(std::string const& key)
{
    if (auto dict = as_dictionary(strict)) {
        dict.removeKey(key);
        return;
    }
    typeWarning("dictionary", "ignoring key removal request");
    QTC::TC("qpdf", "QPDFObjectHandle dictionary ignoring removeKey");
}